

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsRFC4380(CNetAddr *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_c[0] = ' ';
    local_c[1] = '\x01';
    local_c[2] = '\0';
    local_c[3] = '\0';
    uVar1 = (this->m_addr)._size;
    uVar2 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    if (3 < uVar2) {
      if (0x10 < uVar1) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar3 = 0;
      do {
        bVar4 = local_c[lVar3] == (this->m_addr)._union.direct[lVar3];
        if (!bVar4) break;
        bVar5 = lVar3 != 3;
        lVar3 = lVar3 + 1;
      } while (bVar5);
      goto LAB_00699757;
    }
  }
  bVar4 = false;
LAB_00699757:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::IsRFC4380() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 4>{0x20, 0x01, 0x00, 0x00});
}